

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.cpp
# Opt level: O0

void __thiscall
indigox::algorithm::AStarOptimisation::PopulateInitialDistribution
          (AStarOptimisation *this,p_AStarQueueItem *d)

{
  element_type *peVar1;
  size_type sVar2;
  reference pvVar3;
  AStarOptimisation *in_RSI;
  long in_RDI;
  size_t startVert;
  MolVertPair startID;
  uint i;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  value_type vVar4;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe98;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffea0;
  size_type in_stack_fffffffffffffea8;
  key_type *__k;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffeb0;
  key_type *this_00;
  p_AStarQueueItem *d_00;
  p_AStarQueueItem *d_01;
  AStarOptimisation *in_stack_ffffffffffffff00;
  key_type local_c8 [2];
  key_type local_a8 [2];
  p_AStarQueueItem *in_stack_ffffffffffffff78;
  AStarOptimisation *in_stack_ffffffffffffff80;
  uint local_70;
  p_AStarQueueItem local_69 [3];
  p_AStarQueueItem local_31 [3];
  
  std::vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>::size
            ((vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_> *)
             (*(long *)(in_RDI + 8) + 8));
  d_01 = local_31;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x13d97d);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
             (unsigned_long)in_stack_fffffffffffffea0,
             (allocator<unsigned_long> *)in_stack_fffffffffffffe98);
  std::
  __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x13d9a4);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (in_stack_fffffffffffffe98,
             (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x13d9c3);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x13d9d0);
  std::
  __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x13d9da);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset
            (in_stack_fffffffffffffea0);
  std::__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x13d9f4);
  utils::Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>::
  NumVertices((Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
               *)0x13d9fc);
  d_00 = local_69;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x13da13);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
             (unsigned_long)in_stack_fffffffffffffea0,
             (allocator<unsigned_long> *)in_stack_fffffffffffffe98);
  std::
  __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x13da3a);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (in_stack_fffffffffffffe98,
             (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x13da5d);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x13da6a);
  std::
  __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x13da74);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
            (in_stack_fffffffffffffea0);
  local_70 = 0;
  while( true ) {
    peVar1 = std::
             __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x13daa1);
    sVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::size
                      (&peVar1->unchangeable);
    if (sVar2 <= local_70) break;
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                        (size_type)in_stack_fffffffffffffe88);
    if (*pvVar3 != '\0') {
      std::
      __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x13daee);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset
                (in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98);
    }
    local_70 = local_70 + 1;
  }
  std::__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x13dbc4);
  utils::Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>::
  NumVertices((Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
               *)0x13dbcc);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x13dbe3);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
             (unsigned_long)in_stack_fffffffffffffea0,
             (allocator<unsigned_long> *)in_stack_fffffffffffffe98);
  std::
  __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x13dc0a);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (in_stack_fffffffffffffe98,
             (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x13dc2d);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x13dc3a);
  std::
  __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x13dc44);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset
            (in_stack_fffffffffffffea0);
  this_00 = local_c8 + 2;
  std::shared_ptr<indigox::algorithm::AStarQueueItem>::shared_ptr
            ((shared_ptr<indigox::algorithm::AStarQueueItem> *)
             CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
             (shared_ptr<indigox::algorithm::AStarQueueItem> *)in_stack_fffffffffffffe88);
  DetermineCalculable(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::shared_ptr<indigox::algorithm::AStarQueueItem>::~shared_ptr
            ((shared_ptr<indigox::algorithm::AStarQueueItem> *)0x13dc85);
  std::
  __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x13dc8f);
  __k = local_c8;
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),in_stack_fffffffffffffe88
            );
  std::
  __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x13dcb2);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (in_stack_fffffffffffffe98,
             (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x13dcd2);
  peVar1 = std::
           __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x13dcdc);
  peVar1->parent_path_cost = 0;
  std::shared_ptr<indigox::algorithm::AStarQueueItem>::shared_ptr
            ((shared_ptr<indigox::algorithm::AStarQueueItem> *)
             CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
             (shared_ptr<indigox::algorithm::AStarQueueItem> *)in_stack_fffffffffffffe88);
  CalculatePathEnergy(in_stack_ffffffffffffff00,d_01);
  std::shared_ptr<indigox::algorithm::AStarQueueItem>::~shared_ptr
            ((shared_ptr<indigox::algorithm::AStarQueueItem> *)0x13dd1b);
  peVar1 = std::
           __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x13dd25);
  if (peVar1->path_cost != Options::AssignElectrons::INF) {
    std::shared_ptr<indigox::algorithm::AStarQueueItem>::shared_ptr
              ((shared_ptr<indigox::algorithm::AStarQueueItem> *)
               CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               (shared_ptr<indigox::algorithm::AStarQueueItem> *)in_stack_fffffffffffffe88);
    CalculateHeuristicEnergy(in_RSI,d_00);
    std::shared_ptr<indigox::algorithm::AStarQueueItem>::~shared_ptr
              ((shared_ptr<indigox::algorithm::AStarQueueItem> *)0x13dd6f);
  }
  peVar1 = std::
           __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x13de5f);
  peVar1->nbr_start_idx = 0;
  sVar2 = std::vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>::size
                    ((vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
                      *)(*(long *)(in_RDI + 8) + 8));
  if (sVar2 == 0) {
    peVar1 = std::
             __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x13df2b);
    peVar1->nbr_count = '\0';
  }
  else {
    std::vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>::at
              ((vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_> *)
               CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               (size_type)in_stack_fffffffffffffe88);
    sVar2 = in_RDI + 0xc0;
    std::
    map<std::pair<void_*,_void_*>,_void_*,_std::less<std::pair<void_*,_void_*>_>,_std::allocator<std::pair<const_std::pair<void_*,_void_*>,_void_*>_>_>
    ::at((map<std::pair<void_*,_void_*>,_void_*,_std::less<std::pair<void_*,_void_*>_>,_std::allocator<std::pair<const_std::pair<void_*,_void_*>,_void_*>_>_>
          *)this_00,__k);
    std::
    map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
    ::at((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
          *)this_00,&__k->first);
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),sVar2);
    vVar4 = *pvVar3;
    peVar1 = std::
             __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x13df15);
    peVar1->nbr_count = vVar4;
  }
  return;
}

Assistant:

void AStarOptimisation::PopulateInitialDistribution(p_AStarQueueItem d) {
  d->distribution = ElnDist(parent_->possibleLocations_.size());
  d->distribution.reset();
  
  d->unchangeable = VertMask(parent_->elnGraph_->NumVertices());
  d->unchangeable.set();
  for (unsigned int i = 0; i < d->unchangeable.size(); ++i) {
    if (uniqueIDs_.at(i) > 0)
      d->unchangeable.reset(i);
  }
  
  d->calculable = VertMask(parent_->elnGraph_->NumVertices());
  d->calculable.reset();
  DetermineCalculable(d);
  d->new_calculable = VertMask(d->calculable);
  
  d->parent_path_cost = 0;
  CalculatePathEnergy(d);
  if (d->path_cost != opt_::INF) CalculateHeuristicEnergy(d);
  
  d->nbr_start_idx = 0;
  if (parent_->possibleLocations_.size()) {
    MolVertPair startID = parent_->possibleLocations_.at(0);
    size_t startVert = vert2pos_.at(idsToVertex_.at(startID));
    d->nbr_count = (uint32_t)uniqueIDs_.at(startVert);
  } else d->nbr_count = 0;
}